

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageChannel.h
# Opt level: O2

Slice * __thiscall
Imf_2_5::TypedFlatImageChannel<float>::slice
          (Slice *__return_storage_ptr__,TypedFlatImageChannel<float> *this)

{
  int ysm;
  PixelType t;
  
  t = (**(this->super_FlatImageChannel).super_ImageChannel._vptr_ImageChannel)(this);
  ysm = (this->super_FlatImageChannel).super_ImageChannel._ySampling;
  Slice::Slice(__return_storage_ptr__,t,(char *)this->_base,4,
               (long)(this->super_FlatImageChannel).super_ImageChannel._pixelsPerRow << 2,
               (this->super_FlatImageChannel).super_ImageChannel._xSampling,ysm,0.0,SUB41(ysm,0),
               SUB41(t,0));
  return __return_storage_ptr__;
}

Assistant:

Slice
TypedFlatImageChannel<T>::slice () const
{
    return Slice (pixelType(),                 // type
                  (char *) _base,              // base
                  sizeof (T),                  // xStride
                  pixelsPerRow() * sizeof (T), // yStride
                  xSampling(),
                  ySampling());
}